

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

string_view __thiscall
slang::SourceManager::getMacroName(SourceManager *this,SourceLocation location)

{
  pointer pvVar1;
  variant_alternative_t<1UL,_variant<FileInfo,_ExpansionInfo>_> *pvVar2;
  pointer pvVar3;
  ulong uVar4;
  size_t sVar5;
  uint uVar6;
  char *pcVar7;
  bool bVar8;
  string_view sVar9;
  
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  uVar4 = (ulong)location & 0xfffffff;
  bVar8 = uVar4 == 0;
  if ((((!bVar8) && (location != (SourceLocation)0xffffffffffffffff)) &&
      (pvVar3 = (this->bufferEntries).
                super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                ._M_impl.super__Vector_impl_data._M_start, pvVar3 != (pointer)0x0)) &&
     (*(__index_type *)
       ((long)&pvVar3[uVar4].
               super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
               .
               super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
               .
               super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
       + 0x38) == '\x01')) {
    pvVar3 = pvVar3 + uVar4;
    while (*(char *)((long)&(pvVar3->
                            super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                            ).
                            super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                            .
                            super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                    + 0x18) == '\x01') {
      if (bVar8) {
        location = (SourceLocation)0x0;
      }
      else {
        pvVar2 = std::get<1ul,slang::SourceManager::FileInfo,slang::SourceManager::ExpansionInfo>
                           ((this->bufferEntries).
                            super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar4);
        location = (pvVar2->expansionRange).startLoc;
      }
      uVar4 = (ulong)location & 0xfffffff;
      bVar8 = uVar4 == 0;
      if (((bVar8) || (location == (SourceLocation)0xffffffffffffffff)) ||
         ((pvVar1 = (this->bufferEntries).
                    super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, pvVar1 == (pointer)0x0 ||
          (pvVar3 = pvVar1 + uVar4,
          *(__index_type *)
           ((long)&pvVar1[uVar4].
                   super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                   .
                   super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                   .
                   super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
           + 0x38) != '\x01')))) break;
    }
  }
  if (((ulong)location & 0xfffffff) != 0) {
    pvVar3 = (this->bufferEntries).
             super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar7 = (char *)0x0;
    if (pvVar3 != (pointer)0x0) {
      uVar6 = location._0_4_ & 0xfffffff;
      sVar5 = 0;
      if (*(__index_type *)
           ((long)&pvVar3[uVar6].
                   super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                   .
                   super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                   .
                   super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
           + 0x38) == '\x01') {
        sVar5 = *(size_t *)
                 ((long)&pvVar3[uVar6].
                         super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                         .
                         super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                         .
                         super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                 + 0x20);
        pcVar7 = *(char **)((long)&pvVar3[uVar6].
                                   super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                                   .
                                   super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                                   .
                                   super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                           + 0x28);
      }
      goto LAB_00734290;
    }
  }
  pcVar7 = (char *)0x0;
  sVar5 = 0;
LAB_00734290:
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  sVar9._M_str = pcVar7;
  sVar9._M_len = sVar5;
  return sVar9;
}

Assistant:

std::string_view SourceManager::getMacroName(SourceLocation location) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    while (isMacroArgLocImpl(location, lock))
        location = getExpansionRangeImpl(location, lock).start();

    auto buffer = location.buffer();
    if (!buffer)
        return {};

    SLANG_ASSERT(buffer.getId() < bufferEntries.size());
    auto info = std::get_if<ExpansionInfo>(&bufferEntries[buffer.getId()]);
    if (!info)
        return {};

    return info->macroName;
}